

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::MessageFullName_abi_cxx11_
          (string *__return_storage_ptr__,php *this,Descriptor *message,bool is_descriptor)

{
  string *s;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  s = *(string **)(this + 8);
  if ((int)message == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,"google.protobuf",&local_51);
    std::__cxx11::string::string((string *)&local_50,"google.protobuf.internal",&local_52);
    StringReplace(__return_storage_ptr__,s,&local_30,&local_50,false);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MessageFullName(const Descriptor* message, bool is_descriptor) {
  if (is_descriptor) {
    return StringReplace(message->full_name(),
                         "google.protobuf",
                         "google.protobuf.internal", false);
  } else {
    return message->full_name();
  }
}